

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O3

char * oonf_layer2_data_to_string
                 (char *buffer,size_t length,oonf_layer2_data *data,oonf_layer2_metadata *meta,
                 _Bool raw)

{
  long lVar1;
  char *pcVar2;
  undefined7 in_register_00000081;
  isonumber_str iso_str;
  undefined1 local_40 [48];
  
  if (meta->type == OONF_LAYER2_BOOLEAN_DATA) {
    pcVar2 = "false";
    if ((data->_value).boolean != false) {
      pcVar2 = "true";
    }
    pcVar2 = (char *)strscpy(buffer,pcVar2,length,meta,CONCAT71(in_register_00000081,raw));
    return pcVar2;
  }
  if ((meta->type == OONF_LAYER2_INTEGER_DATA) &&
     (lVar1 = isonumber_from_s64(local_40,(data->_value).integer,meta->unit,meta->scaling,raw),
     lVar1 != 0)) {
    pcVar2 = (char *)strscpy(buffer,local_40,length);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

const char *
oonf_layer2_data_to_string(
  char *buffer, size_t length, const struct oonf_layer2_data *data, const struct oonf_layer2_metadata *meta, bool raw) {
  struct isonumber_str iso_str;

  switch (meta->type) {
    case OONF_LAYER2_INTEGER_DATA:
      if (!isonumber_from_s64(&iso_str, data->_value.integer, meta->unit, meta->scaling, raw)) {
        return NULL;
      }
      return strscpy(buffer, iso_str.buf, length);

    case OONF_LAYER2_BOOLEAN_DATA:
      return strscpy(buffer, json_getbool(data->_value.boolean), length);

    default:
      return NULL;
  }
}